

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  utf8_to_utf16 *in_RDX;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_RDI;
  allocator<wchar_t> *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffffc8;
  allocator<wchar_t> local_19 [17];
  anon_class_8_1_8991fb9c_for_f aStack_8;
  
  aStack_8.this = in_RDX;
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_RDI,in_stack_ffffffffffffff88);
  std::allocator<wchar_t>::~allocator(local_19);
  for_each_codepoint<fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(fmt::v8::basic_string_view<char>)::__0>
            (in_stack_ffffffffffffffc8,aStack_8);
  buffer<wchar_t>::push_back(&in_RDI->super_buffer<wchar_t>,(wchar_t *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, int error) {
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
  });
  buffer_.push_back(0);
}